

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall
SQCompiler::ParseTableOrClass(SQCompiler *this,SQInteger separator,SQInteger terminator)

{
  SQFuncState *pSVar1;
  SQOpcode _op;
  SQInteger SVar2;
  undefined8 extraout_RAX;
  SQInteger SVar3;
  SQInteger arg1;
  ulong arg0;
  SQFuncState *pSVar4;
  bool bVar5;
  SQObject SVar6;
  SQInteger SStack_70;
  long local_68;
  SQObject local_60;
  undefined4 local_4c;
  SQInteger local_48;
  SQUnsignedInteger local_40;
  long local_38;
  
  local_40 = (this->_fs->_instructions)._size;
  local_68 = 0;
  local_48 = separator;
  local_38 = terminator;
  do {
    SVar2 = this->_token;
    if (SVar2 == local_38) {
      if (separator == 0x2c) {
        SQFuncState::SetIntructionParam(this->_fs,local_40 - 1,1,local_68);
      }
      Lex(this);
      return;
    }
    if (separator == 0x3b) {
      bVar5 = SVar2 == 0x140;
      if (bVar5) {
        pSVar4 = this->_fs;
        SVar2 = SQFuncState::PushTarget(pSVar4,-1);
        SQFuncState::AddInstruction(pSVar4,_OP_NEWOBJ,SVar2,0,0,0);
        Lex(this);
        ParseTableOrClass(this,0x2c,0x141);
        SVar2 = this->_token;
      }
      if (SVar2 == 0x142) {
        Lex(this);
        SVar2 = this->_token;
        local_4c = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),2);
      }
      else {
        local_4c = 0;
      }
    }
    else {
      local_4c = 0;
      bVar5 = false;
    }
    if (SVar2 == 0x5b) {
      Lex(this);
      CommaExpr(this);
      Expect(this,0x5d);
      Expect(this,0x3d);
      Expression(this);
    }
    else {
      if (SVar2 == 0x103) {
        pSVar4 = this->_fs;
        if (separator != 0x2c) goto LAB_0011e9fa;
        SVar2 = SQFuncState::PushTarget(pSVar4,-1);
        pSVar1 = this->_fs;
        SVar6 = Expect(this,0x103);
        local_60._unVal = SVar6._unVal;
        local_60._type = SVar6._type;
        SVar3 = SQFuncState::GetConstant(pSVar1,&local_60);
        SQFuncState::AddInstruction(pSVar4,_OP_LOAD,SVar2,SVar3,0,0);
        SStack_70 = 0x3a;
      }
      else {
        if ((SVar2 == 0x11d) || (SVar2 == 0x136)) {
          Lex(this);
          if (SVar2 == 0x11d) {
            SVar6 = Expect(this,0x102);
          }
          else {
            SVar6 = SQFuncState::CreateString(this->_fs,"constructor",-1);
          }
          local_60._unVal = SVar6._unVal;
          local_60._type = SVar6._type;
          Expect(this,0x28);
          pSVar4 = this->_fs;
          SVar2 = SQFuncState::PushTarget(pSVar4,-1);
          SVar3 = SQFuncState::GetConstant(this->_fs,&local_60);
          SQFuncState::AddInstruction(pSVar4,_OP_LOAD,SVar2,SVar3,0,0);
          CreateFunction(this,&local_60,false);
          pSVar4 = this->_fs;
          SVar2 = SQFuncState::PushTarget(pSVar4,-1);
          SQFuncState::AddInstruction
                    (pSVar4,_OP_CLOSURE,SVar2,(this->_fs->_functions)._size - 1,0,0);
          goto LAB_0011ea62;
        }
        pSVar4 = this->_fs;
LAB_0011e9fa:
        SVar2 = SQFuncState::PushTarget(pSVar4,-1);
        pSVar1 = this->_fs;
        SVar6 = Expect(this,0x102);
        local_60._unVal = SVar6._unVal;
        local_60._type = SVar6._type;
        SVar3 = SQFuncState::GetConstant(pSVar1,&local_60);
        SQFuncState::AddInstruction(pSVar4,_OP_LOAD,SVar2,SVar3,0,0);
        SStack_70 = 0x3d;
      }
      Expect(this,SStack_70);
      Expression(this);
      separator = local_48;
    }
LAB_0011ea62:
    if (this->_token == separator) {
      Lex(this);
    }
    SVar2 = SQFuncState::PopTarget(this->_fs);
    SVar3 = SQFuncState::PopTarget(this->_fs);
    if (bVar5 != false) {
      SQFuncState::PopTarget(this->_fs);
    }
    arg1 = SQFuncState::TopTarget(this->_fs);
    if (separator == 0x2c) {
      pSVar4 = this->_fs;
      arg0 = 0xff;
      _op = _OP_NEWSLOT;
    }
    else {
      arg0 = (ulong)(bVar5 | (byte)local_4c);
      pSVar4 = this->_fs;
      _op = _OP_NEWSLOTA;
    }
    SQFuncState::AddInstruction(pSVar4,_op,arg0,arg1,SVar3,SVar2);
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

void ParseTableOrClass(SQInteger separator,SQInteger terminator)
    {
        SQInteger tpos = _fs->GetCurrentPos(),nkeys = 0;
        while(_token != terminator) {
            bool hasattrs = false;
            bool isstatic = false;
            //check if is an attribute
            if(separator == ';') {
                if(_token == TK_ATTR_OPEN) {
                    _fs->AddInstruction(_OP_NEWOBJ, _fs->PushTarget(),0,NOT_TABLE); Lex();
                    ParseTableOrClass(',',TK_ATTR_CLOSE);
                    hasattrs = true;
                }
                if(_token == TK_STATIC) {
                    isstatic = true;
                    Lex();
                }
            }
            switch(_token) {
            case TK_FUNCTION:
            case TK_CONSTRUCTOR:{
                SQInteger tk = _token;
                Lex();
                SQObject id = tk == TK_FUNCTION ? Expect(TK_IDENTIFIER) : _fs->CreateString(_SC("constructor"));
                Expect(_SC('('));
                _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(id));
                CreateFunction(id);
                _fs->AddInstruction(_OP_CLOSURE, _fs->PushTarget(), _fs->_functions.size() - 1, 0);
                                }
                                break;
            case _SC('['):
                Lex(); CommaExpr(); Expect(_SC(']'));
                Expect(_SC('=')); Expression();
                break;
            case TK_STRING_LITERAL: //JSON
                if(separator == ',') { //only works for tables
                    _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(Expect(TK_STRING_LITERAL)));
                    Expect(_SC(':')); Expression();
                    break;
                }
            default :
                _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(Expect(TK_IDENTIFIER)));
                Expect(_SC('=')); Expression();
            }
            if(_token == separator) Lex();//optional comma/semicolon
            nkeys++;
            SQInteger val = _fs->PopTarget();
            SQInteger key = _fs->PopTarget();
            SQInteger attrs = hasattrs ? _fs->PopTarget():-1;
            ((void)attrs);
            assert((hasattrs && (attrs == key-1)) || !hasattrs);
            unsigned char flags = (hasattrs?NEW_SLOT_ATTRIBUTES_FLAG:0)|(isstatic?NEW_SLOT_STATIC_FLAG:0);
            SQInteger table = _fs->TopTarget(); //<<BECAUSE OF THIS NO COMMON EMIT FUNC IS POSSIBLE
            if(separator == _SC(',')) { //hack recognizes a table from the separator
                _fs->AddInstruction(_OP_NEWSLOT, 0xFF, table, key, val);
            }
            else {
                _fs->AddInstruction(_OP_NEWSLOTA, flags, table, key, val); //this for classes only as it invokes _newmember
            }
        }
        if(separator == _SC(',')) //hack recognizes a table from the separator
            _fs->SetIntructionParam(tpos, 1, nkeys);
        Lex();
    }